

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSpatialAnchorCreateCompletionBD *value)

{
  bool bVar1;
  NextChainResult NVar2;
  ValidateXrHandleResult VVar3;
  XrResult XVar4;
  undefined4 in_stack_fffffffffffffd38;
  uint32_t in_stack_fffffffffffffd3c;
  allocator local_2b9;
  string local_2b8;
  string *local_298;
  allocator local_289;
  string local_288;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar4 = XR_SUCCESS;
  local_298 = command_name;
  if (value->type != XR_TYPE_SPATIAL_ANCHOR_CREATE_COMPLETION_BD) {
    XVar4 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSpatialAnchorCreateCompletionBD",
               value->type,"VUID-XrSpatialAnchorCreateCompletionBD-type-type",
               XR_TYPE_SPATIAL_ANCHOR_CREATE_COMPLETION_BD,
               "XR_TYPE_SPATIAL_ANCHOR_CREATE_COMPLETION_BD");
  }
  if (!check_pnext) goto LAB_001ad5b3;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar2 = ValidateNextChain(instance_info,local_298,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2b8);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2b8,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::string
              ((string *)&local_2b8,"VUID-XrSpatialAnchorCreateCompletionBD-next-unique",&local_2b9)
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_288,
               "Multiple structures of the same type(s) in \"next\" chain for XrSpatialAnchorCreateCompletionBD struct"
               ,&local_289);
    CoreValidLogMessage(instance_info,&local_2b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_298,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_2b8);
LAB_001ad57e:
    std::__cxx11::string::~string((string *)&error_message);
    XVar4 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrSpatialAnchorCreateCompletionBD-next-next",
               (allocator *)&local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2b8,
               "Invalid structure(s) in \"next\" chain for XrSpatialAnchorCreateCompletionBD struct \"next\""
               ,&local_2b9);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_298,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_001ad57e;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001ad5b3:
  if (check_members && XVar4 == XR_SUCCESS) {
    std::__cxx11::string::string
              ((string *)&error_message,"XrSpatialAnchorCreateCompletionBD",(allocator *)&local_288)
    ;
    std::__cxx11::string::string
              ((string *)&local_2b8,"futureResult",(allocator *)&valid_ext_structs);
    bVar1 = ValidateXrEnum(instance_info,local_298,&error_message,&local_2b8,objects_info,
                           value->futureResult);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&error_message);
    if (bVar1) {
      VVar3 = VerifyXrAnchorBDHandle(&value->anchor);
      XVar4 = XR_SUCCESS;
      if (VVar3 != VALIDATE_XR_HANDLE_SUCCESS) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,"Invalid XrAnchorBD handle \"anchor\" ");
        HandleToHexString<XrAnchorBD_T*>
                  ((XrAnchorBD_T *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        std::operator<<((ostream *)&error_message,(string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::string
                  ((string *)&local_2b8,"VUID-XrSpatialAnchorCreateCompletionBD-anchor-parameter",
                   (allocator *)&valid_ext_structs);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_228,objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&local_2b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_298,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_228,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_228);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
        XVar4 = XR_ERROR_HANDLE_INVALID;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrSpatialAnchorCreateCompletionBD contains invalid XrResult \"futureResult\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd3c);
      std::operator<<((ostream *)&error_message,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string
                ((string *)&local_2b8,
                 "VUID-XrSpatialAnchorCreateCompletionBD-futureResult-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_210,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_2b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_298,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_210,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_210);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
      XVar4 = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  return XVar4;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSpatialAnchorCreateCompletionBD* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SPATIAL_ANCHOR_CREATE_COMPLETION_BD) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSpatialAnchorCreateCompletionBD",
                             value->type, "VUID-XrSpatialAnchorCreateCompletionBD-type-type", XR_TYPE_SPATIAL_ANCHOR_CREATE_COMPLETION_BD, "XR_TYPE_SPATIAL_ANCHOR_CREATE_COMPLETION_BD");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSpatialAnchorCreateCompletionBD-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSpatialAnchorCreateCompletionBD struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSpatialAnchorCreateCompletionBD : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSpatialAnchorCreateCompletionBD-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSpatialAnchorCreateCompletionBD struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrResult value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrSpatialAnchorCreateCompletionBD", "futureResult", objects_info, value->futureResult)) {
        std::ostringstream oss_enum;
        oss_enum << "XrSpatialAnchorCreateCompletionBD contains invalid XrResult \"futureResult\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->futureResult));
        CoreValidLogMessage(instance_info, "VUID-XrSpatialAnchorCreateCompletionBD-futureResult-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    {
        // writeValidateInlineHandleValidation
        ValidateXrHandleResult handle_result = VerifyXrAnchorBDHandle(&value->anchor);
        if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
            // Not a valid handle or NULL (which is not valid in this case)
            std::ostringstream oss;
            oss << "Invalid XrAnchorBD handle \"anchor\" ";
            oss << HandleToHexString(value->anchor);
            CoreValidLogMessage(instance_info, "VUID-XrSpatialAnchorCreateCompletionBD-anchor-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, oss.str());
            return XR_ERROR_HANDLE_INVALID;
        }
    }
    // Everything checked out properly
    return xr_result;
}